

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O0

UnicodeSet * __thiscall icu_63::UnicodeSet::retainAll(UnicodeSet *this,UnicodeSet *c)

{
  UBool UVar1;
  UnicodeSet *c_local;
  UnicodeSet *this_local;
  
  UVar1 = isFrozen(this);
  if ((UVar1 == '\0') && (UVar1 = isBogus(this), UVar1 == '\0')) {
    retain(this,c->list,c->len,'\0');
    UVector::retainAll(this->strings,c->strings);
  }
  return this;
}

Assistant:

UnicodeSet& UnicodeSet::retainAll(const UnicodeSet& c) {
    if (isFrozen() || isBogus()) {
        return *this;
    }
    retain(c.list, c.len, 0);
    strings->retainAll(*c.strings);
    return *this;
}